

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MutablePriorityQueue.h
# Opt level: O1

void __thiscall
MutablePriorityQueue<Vertex<std::pair<double,_double>_>_>::heapifyDown
          (MutablePriorityQueue<Vertex<std::pair<double,_double>_>_> *this,uint i)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  Vertex<std::pair<double,_double>_> *pVVar4;
  pointer ppVVar5;
  Vertex<std::pair<double,_double>_> *pVVar6;
  uint uVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  pVVar4 = (this->H).
           super__Vector_base<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_start[i];
  bVar3 = this->inv;
  uVar9 = (ulong)((bVar3 & 1) << 4);
  do {
    uVar7 = i * 2;
    uVar10 = (ulong)uVar7;
    ppVVar5 = (this->H).
              super__Vector_base<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar12 = (long)(this->H).
                   super__Vector_base<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar5 >> 3;
    if (uVar10 < uVar12) {
      uVar11 = (ulong)(uVar7 | 1);
      if ((uVar11 < uVar12) &&
         (dVar2 = *(double *)((long)&ppVVar5[uVar10]->dist + uVar9),
         pdVar1 = (double *)((long)&ppVVar5[uVar11]->dist + uVar9), uVar10 = uVar11,
         dVar2 < *pdVar1 || dVar2 == *pdVar1)) {
        uVar10 = (ulong)uVar7;
      }
      pVVar6 = ppVVar5[uVar10];
      dVar2 = *(double *)((long)&pVVar4->dist + uVar9);
      pdVar1 = (double *)((long)&pVVar6->dist + uVar9);
      if (dVar2 < *pdVar1 || dVar2 == *pdVar1) goto LAB_0010faa7;
      ppVVar5[i] = pVVar6;
      if ((bVar3 & 1U) == 0) {
        pVVar6->queueIndex = i;
      }
      else {
        pVVar6->queueIndexInv = i;
      }
      bVar8 = true;
      i = (uint)uVar10;
    }
    else {
LAB_0010faa7:
      bVar8 = false;
    }
    if (!bVar8) {
      (this->H).
      super__Vector_base<Vertex<std::pair<double,_double>_>_*,_std::allocator<Vertex<std::pair<double,_double>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start[i] = pVVar4;
      if (this->inv == true) {
        pVVar4->queueIndexInv = i;
      }
      else {
        pVVar4->queueIndex = i;
      }
      return;
    }
  } while( true );
}

Assistant:

void MutablePriorityQueue<T>::heapifyDown(unsigned i) {
	auto x = H[i];
	while (true) {
		unsigned k = leftChild(i);
		if (k >= H.size())
			break;
		if (k+1 < H.size() && (*H[k+1]).compare(*H[k], inv))
			++k; // right child of i
		if ( ! ((*H[k]).compare(*x, inv)) )
			break;
		set(i, H[k]);
		i = k;
	}
	set(i, x);
}